

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_impl::on_lsd_peer(session_impl *this,endpoint *peer,sha1_hash *ih)

{
  _Atomic_word *p_Var1;
  int *piVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  _WordT _Var7;
  int iVar8;
  element_type *peVar9;
  dht_logger dVar10;
  torrent *this_00;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 local_88 [8];
  anon_union_16_3_a3f0114d_for___in6_u local_80;
  lsd_callback local_70;
  string local_68;
  undefined1 local_44 [16];
  
  counters::inc_stats_counter(&this->m_stats_counters,0x3d,1);
  local_68.field_2._M_allocated_capacity._0_4_ = (ih->m_number)._M_elems[4];
  local_68._M_dataplus._M_p = *(pointer *)(ih->m_number)._M_elems;
  local_68._M_string_length = *(size_type *)((ih->m_number)._M_elems + 2);
  local_68.field_2._M_allocated_capacity._4_4_ = 0;
  stack0xffffffffffffffb0 = SUB1612((undefined1  [16])0x0,4);
  local_44 = (undefined1  [16])0x0;
  find_torrent((session_impl *)local_88,(info_hash_t *)this);
  if ((_func_int **)local_80._0_8_ == (_func_int **)0x0) {
    return;
  }
  iVar8 = *(_Atomic_word *)(local_80._0_8_ + 8);
  this_00 = (torrent *)0x0;
  do {
    if (iVar8 == 0) {
      dVar10._vptr_dht_logger = (_func_int **)0x0;
      goto LAB_002ca8d4;
    }
    LOCK();
    iVar3 = *(_Atomic_word *)(local_80._0_8_ + 8);
    bVar11 = iVar8 == iVar3;
    if (bVar11) {
      *(_Atomic_word *)(local_80._0_8_ + 8) = iVar8 + 1;
      iVar3 = iVar8;
    }
    iVar8 = iVar3;
    UNLOCK();
  } while (!bVar11);
  dVar10._vptr_dht_logger = (_func_int **)local_80._0_8_;
  if (*(_Atomic_word *)(local_80._0_8_ + 8) == 0) {
    this_00 = (torrent *)0x0;
  }
  else {
    this_00 = (torrent *)CONCAT44(local_88._4_4_,local_88._0_4_);
  }
LAB_002ca8d4:
  if ((_func_int **)local_80._0_8_ != (_func_int **)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)(local_80._0_8_ + 0xc);
      iVar8 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar8 = *(_Atomic_word *)(local_80._0_8_ + 0xc);
      *(int *)(local_80._0_8_ + 0xc) = iVar8 + -1;
    }
    if (iVar8 == 1) {
      (**(code **)(*(long *)local_80._0_8_ + 0x18))();
    }
  }
  if (this_00 != (torrent *)0x0) {
    peVar9 = (this_00->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar4 = (peVar9->m_flags).m_val;
    if ((bVar4 & 2) == 0) {
      if ((bVar4 & 4) != 0) {
        local_68._M_dataplus._M_p = (pointer)&(this->m_settings).m_mutex;
        local_68._M_string_length = local_68._M_string_length & 0xffffffffffffff00;
        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_68);
        local_68._M_string_length = CONCAT71(local_68._M_string_length._1_7_,1);
        _Var7 = (this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w[0];
        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_68);
        if (((uint)_Var7 >> 0x17 & 1) == 0) goto LAB_002caab0;
        peVar9 = (this_00->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      auVar12[0] = -((char)(ih->m_number)._M_elems[0] ==
                    (char)(peVar9->m_info_hash).v1.m_number._M_elems[0]);
      auVar12[1] = -(*(char *)((long)(ih->m_number)._M_elems + 1) ==
                    *(char *)((long)(peVar9->m_info_hash).v1.m_number._M_elems + 1));
      auVar12[2] = -(*(char *)((long)(ih->m_number)._M_elems + 2) ==
                    *(char *)((long)(peVar9->m_info_hash).v1.m_number._M_elems + 2));
      auVar12[3] = -(*(char *)((long)(ih->m_number)._M_elems + 3) ==
                    *(char *)((long)(peVar9->m_info_hash).v1.m_number._M_elems + 3));
      auVar12[4] = -((char)(ih->m_number)._M_elems[1] ==
                    (char)(peVar9->m_info_hash).v1.m_number._M_elems[1]);
      auVar12[5] = -(*(char *)((long)(ih->m_number)._M_elems + 5) ==
                    *(char *)((long)(peVar9->m_info_hash).v1.m_number._M_elems + 5));
      auVar12[6] = -(*(char *)((long)(ih->m_number)._M_elems + 6) ==
                    *(char *)((long)(peVar9->m_info_hash).v1.m_number._M_elems + 6));
      auVar12[7] = -(*(char *)((long)(ih->m_number)._M_elems + 7) ==
                    *(char *)((long)(peVar9->m_info_hash).v1.m_number._M_elems + 7));
      auVar12[8] = -((char)(ih->m_number)._M_elems[2] ==
                    (char)(peVar9->m_info_hash).v1.m_number._M_elems[2]);
      auVar12[9] = -(*(char *)((long)(ih->m_number)._M_elems + 9) ==
                    *(char *)((long)(peVar9->m_info_hash).v1.m_number._M_elems + 9));
      auVar12[10] = -(*(char *)((long)(ih->m_number)._M_elems + 10) ==
                     *(char *)((long)(peVar9->m_info_hash).v1.m_number._M_elems + 10));
      auVar12[0xb] = -(*(char *)((long)(ih->m_number)._M_elems + 0xb) ==
                      *(char *)((long)(peVar9->m_info_hash).v1.m_number._M_elems + 0xb));
      auVar12[0xc] = -((char)(ih->m_number)._M_elems[3] ==
                      (char)(peVar9->m_info_hash).v1.m_number._M_elems[3]);
      auVar12[0xd] = -(*(char *)((long)(ih->m_number)._M_elems + 0xd) ==
                      *(char *)((long)(peVar9->m_info_hash).v1.m_number._M_elems + 0xd));
      auVar12[0xe] = -(*(char *)((long)(ih->m_number)._M_elems + 0xe) ==
                      *(char *)((long)(peVar9->m_info_hash).v1.m_number._M_elems + 0xe));
      auVar12[0xf] = -(*(char *)((long)(ih->m_number)._M_elems + 0xf) ==
                      *(char *)((long)(peVar9->m_info_hash).v1.m_number._M_elems + 0xf));
      uVar5 = (peVar9->m_info_hash).v1.m_number._M_elems[4];
      uVar6 = (ih->m_number)._M_elems[4];
      auVar13[0] = -((char)uVar6 == (char)uVar5);
      auVar13[1] = -((char)(uVar6 >> 8) == (char)(uVar5 >> 8));
      auVar13[2] = -((char)(uVar6 >> 0x10) == (char)(uVar5 >> 0x10));
      auVar13[3] = -((char)(uVar6 >> 0x18) == (char)(uVar5 >> 0x18));
      auVar13[4] = 0xff;
      auVar13[5] = 0xff;
      auVar13[6] = 0xff;
      auVar13[7] = 0xff;
      auVar13[8] = 0xff;
      auVar13[9] = 0xff;
      auVar13[10] = 0xff;
      auVar13[0xb] = 0xff;
      auVar13[0xc] = 0xff;
      auVar13[0xd] = 0xff;
      auVar13[0xe] = 0xff;
      auVar13[0xf] = 0xff;
      auVar13 = auVar13 & auVar12;
      torrent::add_peer(this_00,peer,(peer_source_flags_t)0x8,
                        (pex_flags_t)
                        (((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff) * -0x80 +
                        0x80));
      if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
        bVar11 = (peer->impl_).data_.base.sa_family != 2;
        if (bVar11) {
          local_80 = (peer->impl_).data_.v6.sin6_addr.__in6_u;
          local_70._vptr_lsd_callback = (_func_int **)(ulong)(peer->impl_).data_.v6.sin6_scope_id;
          local_88._4_4_ = 0;
        }
        else {
          local_88._4_4_ = (peer->impl_).data_.v4.sin_addr.s_addr;
          local_80 = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
          local_70._vptr_lsd_callback = (_func_int **)0x0;
        }
        local_88._0_4_ = ZEXT14(bVar11);
        boost::asio::ip::address::to_string_abi_cxx11_(&local_68,(address *)local_88);
        (*(this_00->super_request_callback)._vptr_request_callback[7])
                  (this_00,"lsd add_peer() [ %s ]",local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,
                          CONCAT44(local_68.field_2._M_allocated_capacity._4_4_,
                                   local_68.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
      torrent::do_connect_boost(this_00);
      if (((this->m_alerts).m_alert_mask._M_i.m_val & 2) != 0) {
        torrent::get_handle((torrent *)local_88);
        alert_manager::
        emplace_alert<libtorrent::lsd_peer_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&>
                  (&this->m_alerts,(torrent_handle *)local_88,peer);
        if ((_func_int **)local_80._0_8_ != (_func_int **)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar2 = (int *)(local_80._0_8_ + 0xc);
            iVar8 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
          }
          else {
            iVar8 = *(int *)(local_80._0_8_ + 0xc);
            *(int *)(local_80._0_8_ + 0xc) = iVar8 + -1;
          }
          if (iVar8 == 1) {
            (**(code **)(*(long *)local_80._0_8_ + 0x18))();
          }
        }
      }
    }
  }
LAB_002caab0:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar10._vptr_dht_logger !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar10._vptr_dht_logger);
  }
  return;
}

Assistant:

void session_impl::on_lsd_peer(tcp::endpoint const& peer, sha1_hash const& ih)
	{
		m_stats_counters.inc_stats_counter(counters::on_lsd_peer_counter);
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

		std::shared_ptr<torrent> t = find_torrent(info_hash_t(ih)).lock();
		if (!t) return;
		// don't add peers from lsd to private torrents
		if (t->torrent_file().priv() || (t->torrent_file().is_i2p()
			&& !m_settings.get_bool(settings_pack::allow_i2p_mixed))) return;

		protocol_version const v = ih == t->torrent_file().info_hashes().v1
			? protocol_version::V1 : protocol_version::V2;

		t->add_peer(peer, peer_info::lsd, v == protocol_version::V2 ? pex_lt_v2 : pex_flags_t(0));
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			t->debug_log("lsd add_peer() [ %s ]"
				, peer.address().to_string().c_str());
		}
#endif
		t->do_connect_boost();

		if (m_alerts.should_post<lsd_peer_alert>())
			m_alerts.emplace_alert<lsd_peer_alert>(t->get_handle(), peer);
	}